

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftlib.c
# Opt level: O0

void fftrecurs(float *ioptr,long M,float *Utbl,long Ustride,long NDiffU,long StageCnt)

{
  float *in_RCX;
  long in_RDX;
  float *in_RSI;
  long in_R8;
  long in_R9;
  long i1;
  long in_stack_00000068;
  long in_stack_00000070;
  long in_stack_00000078;
  float *in_stack_00000080;
  long in_stack_00000088;
  float *in_stack_00000090;
  long StageCnt_00;
  
  if (in_RSI < (float *)0xc) {
    bfstages(in_stack_00000090,in_stack_00000088,in_stack_00000080,in_stack_00000078,
             in_stack_00000070,in_stack_00000068);
  }
  else {
    for (StageCnt_00 = 0; StageCnt_00 < 8; StageCnt_00 = StageCnt_00 + 1) {
      fftrecurs(in_RSI,in_RDX,in_RCX,in_R8,in_R9,StageCnt_00);
    }
    bfstages(in_stack_00000090,in_stack_00000088,in_stack_00000080,in_stack_00000078,
             in_stack_00000070,in_stack_00000068);
  }
  return;
}

Assistant:

void fftrecurs(float *ioptr, long M, float *Utbl, long Ustride, long NDiffU, long StageCnt){
/* recursive bfstages calls to maximize on chip cache efficiency */
long i1;
if (M <= MCACHE)  // fits on chip ?
	bfstages(ioptr, M, Utbl, Ustride, NDiffU, StageCnt);		/*  RADIX 8 Stages	*/
else{
	for (i1=0; i1<8; i1++){
		fftrecurs(&ioptr[i1*POW2(M-3)*2], M-3, Utbl, 8*Ustride, NDiffU, StageCnt-1);	/*  RADIX 8 Stages	*/
	}
	bfstages(ioptr, M, Utbl, Ustride, POW2(M-3), 1);	/*  RADIX 8 Stage	*/
}
}